

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void shieldeff(xchar x,xchar y)

{
  int local_10;
  int i;
  xchar y_local;
  xchar x_local;
  
  if (('\0' < flags.sparkle) && ((viz_array[y][x] & 2U) != 0)) {
    for (local_10 = 0; local_10 < 0x15; local_10 = flags.sparkle + local_10) {
      dbuf_set_effect((int)x,(int)y,shield_static[local_10] + 1U | 0x40000);
      flush_screen();
      (*windowprocs.win_delay)();
    }
    dbuf_set_effect((int)x,(int)y,0);
  }
  return;
}

Assistant:

void shieldeff(xchar x, xchar y)
{
    int i;

    if (flags.sparkle <= 0)
	return;

    if (cansee(x,y)) {	/* Don't see anything if can't see the location */
	for (i = 0; i < SHIELD_COUNT; i += flags.sparkle) {
	    dbuf_set_effect(x, y, dbuf_effect(E_MISC, shield_static[i]));
	    flush_screen();	/* make sure the effect shows up */
	    win_delay_output();
	}

	dbuf_set_effect(x, y, 0);
    }
}